

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O1

void __thiscall InterpTest_Local_Trace_Test::TestBody(InterpTest_Local_Trace_Test *this)

{
  pointer pRVar1;
  char *message;
  Result result;
  unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_> buf;
  Ptr trap;
  Ptr func;
  MemoryStream stream;
  Values results;
  Result local_ec;
  undefined1 local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_e0;
  pointer local_d8;
  Message local_d0;
  Ptr local_c8;
  Ptr local_a8;
  undefined1 local_88 [16];
  pointer local_78;
  unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_> local_68;
  Values local_58;
  AssertHelper local_38;
  
  local_88._0_8_ = (pointer)0x0;
  local_88._8_8_ = (pointer)0x0;
  local_78 = (pointer)0x0;
  local_88._0_8_ = operator_new(0x41);
  pRVar1 = (pointer)((long)&((pointer)(local_88._0_8_ + 0x40))->index + 1);
  local_78 = pRVar1;
  memcpy((void *)local_88._0_8_,&DAT_001ea57a,0x41);
  local_88._8_8_ = pRVar1;
  InterpTest::ReadModule
            (&this->super_InterpTest,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88);
  if ((pointer)local_88._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_88._0_8_,(long)local_78 - local_88._0_8_);
  }
  local_88._0_8_ = (pointer)0x0;
  local_88._8_8_ = (pointer)0x0;
  local_78 = (pointer)0x0;
  InterpTest::Instantiate(&this->super_InterpTest,(RefVec *)local_88);
  if ((pointer)local_88._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_88._0_8_,(long)local_78 - local_88._0_8_);
  }
  InterpTest::GetFuncExport(&local_a8,&this->super_InterpTest,0);
  local_58.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.root_index_ = 0;
  local_c8.obj_ = (Trap *)0x0;
  local_c8.store_ = (Store *)0x0;
  wabt::MemoryStream::MemoryStream((MemoryStream *)local_88,(Stream *)0x0);
  local_d8 = (pointer)0x0;
  local_e8 = (undefined1  [8])0x0;
  pbStack_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_ec = wabt::interp::Func::Call
                       (&(local_a8.obj_)->super_Func,&(this->super_InterpTest).store_,
                        (Values *)local_e8,&local_58,&local_c8,(Stream *)local_88);
  if (local_e8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_e8,(long)local_d8 - (long)local_e8);
  }
  local_d0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
            ((internal *)local_e8,"Result::Ok","result",(Enum *)&local_d0,&local_ec);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message(&local_d0);
    if (pbStack_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (pbStack_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
               ,0xfa,message);
    testing::internal::AssertHelper::operator=(&local_38,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((long *)CONCAT44(local_d0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_d0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_d0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_d0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
    if (pbStack_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_e0,pbStack_e0);
    }
  }
  else {
    if (pbStack_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_e0,pbStack_e0);
    }
    wabt::MemoryStream::ReleaseOutputBuffer((MemoryStream *)local_88);
    InterpTest::ExpectBufferStrEq
              (&this->super_InterpTest,(OutputBuffer *)local_e8,
               "#0.    0: V:0  | alloca 4\n#0.    8: V:4  | i32.const 0\n#0.   16: V:5  | local.set $5, 0\n#0.   24: V:4  | i64.const 1\n#0.   36: V:5  | local.set $4, 1\n#0.   44: V:4  | f32.const 2\n#0.   52: V:5  | local.set $3, 2\n#0.   60: V:4  | f64.const 3\n#0.   72: V:5  | local.set $2, 3\n#0.   80: V:4  | drop_keep $4 $0\n#0.   92: V:0  | return\n"
              );
    if (local_e8 != (undefined1  [8])0x0) {
      std::default_delete<wabt::OutputBuffer>::operator()
                ((default_delete<wabt::OutputBuffer> *)local_e8,(OutputBuffer *)local_e8);
    }
  }
  local_88._0_8_ = &PTR__MemoryStream_0024a0a0;
  if (local_68._M_t.
      super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>._M_t.
      super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>.
      super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>)0x0) {
    std::default_delete<wabt::OutputBuffer>::operator()
              ((default_delete<wabt::OutputBuffer> *)&local_68,
               (OutputBuffer *)
               local_68._M_t.
               super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>.
               _M_t.
               super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>
               .super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl);
  }
  if (local_c8.obj_ != (Trap *)0x0) {
    wabt::interp::Store::DeleteRoot(local_c8.store_,local_c8.root_index_);
    local_c8.obj_ = (Trap *)0x0;
    local_c8.store_ = (Store *)0x0;
    local_c8.root_index_ = 0;
  }
  if (local_58.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a8.obj_ != (DefinedFunc *)0x0) {
    wabt::interp::Store::DeleteRoot(local_a8.store_,local_a8.root_index_);
  }
  return;
}

Assistant:

TEST_F(InterpTest, Local_Trace) {
  // (func (export "a")
  //   (local i32 i64 f32 f64)
  //   (local.set 0 (i32.const 0))
  //   (local.set 1 (i64.const 1))
  //   (local.set 2 (f32.const 2))
  //   (local.set 3 (f64.const 3)))
  ReadModule({
      0x00, 0x61, 0x73, 0x6d, 0x01, 0x00, 0x00, 0x00, 0x01, 0x04, 0x01,
      0x60, 0x00, 0x00, 0x03, 0x02, 0x01, 0x00, 0x07, 0x05, 0x01, 0x01,
      0x61, 0x00, 0x00, 0x0a, 0x26, 0x01, 0x24, 0x04, 0x01, 0x7f, 0x01,
      0x7e, 0x01, 0x7d, 0x01, 0x7c, 0x41, 0x00, 0x21, 0x00, 0x42, 0x01,
      0x21, 0x01, 0x43, 0x00, 0x00, 0x00, 0x40, 0x21, 0x02, 0x44, 0x00,
      0x00, 0x00, 0x00, 0x00, 0x00, 0x08, 0x40, 0x21, 0x03, 0x0b,
  });

  Instantiate();
  auto func = GetFuncExport(0);

  Values results;
  Trap::Ptr trap;
  MemoryStream stream;
  Result result = func->Call(store_, {}, results, &trap, &stream);
  ASSERT_EQ(Result::Ok, result);

  auto buf = stream.ReleaseOutputBuffer();
  ExpectBufferStrEq(*buf,
R"(#0.    0: V:0  | alloca 4
#0.    8: V:4  | i32.const 0
#0.   16: V:5  | local.set $5, 0
#0.   24: V:4  | i64.const 1
#0.   36: V:5  | local.set $4, 1
#0.   44: V:4  | f32.const 2
#0.   52: V:5  | local.set $3, 2
#0.   60: V:4  | f64.const 3
#0.   72: V:5  | local.set $2, 3
#0.   80: V:4  | drop_keep $4 $0
#0.   92: V:0  | return
)");
}